

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void presolve::HPresolve::debug(HighsLp *lp,HighsOptions *options)

{
  value_type vVar1;
  value_type vVar2;
  HighsModelStatus HVar3;
  undefined1 uVar4;
  HighsModelStatus HVar5;
  HighsInt HVar6;
  reference pvVar7;
  reference pvVar8;
  HighsInfo *pHVar9;
  pointer in_RSI;
  Highs highs_1;
  HighsInt i_1;
  HighsInt i;
  HighsSolution temp_sol;
  HighsBasis temp_basis;
  HighsPostsolveStack tmp;
  HPresolve presolve_1;
  HPresolve presolve_2;
  size_t reductionLim;
  size_t bad;
  size_t good;
  bool checkResult;
  State state;
  KktInfo kktinfo;
  vector<double,_std::allocator<double>_> ARvalue;
  vector<int,_std::allocator<int>_> ARindex;
  vector<int,_std::allocator<int>_> ARstart;
  vector<int,_std::allocator<int>_> Aend;
  vector<int,_std::allocator<int>_> flagRow;
  vector<int,_std::allocator<int>_> flagCol;
  Highs highs;
  HPresolve presolve;
  HighsPostsolveStack postsolve_stack;
  HighsLp model;
  HighsBasis basis;
  HighsSolution sol;
  HighsBasis reducedbasis;
  HighsSolution reducedsol;
  HighsLp *in_stack_ffffffffffff3538;
  HighsLp *solution;
  Highs *in_stack_ffffffffffff3540;
  Highs *in_stack_ffffffffffff3548;
  Highs *this;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff3550;
  vector<double,_std::allocator<double>_> *ARvalue_;
  undefined8 in_stack_ffffffffffff3558;
  undefined8 colCost_;
  undefined8 in_stack_ffffffffffff3560;
  undefined8 this_00;
  pointer in_stack_ffffffffffff3568;
  vector<double,_std::allocator<double>_> *colUpper_;
  HighsPostsolveStack *in_stack_ffffffffffff3570;
  HighsPostsolveStack *this_01;
  HighsSolution *in_stack_ffffffffffff3578;
  HighsSolution *solution_00;
  HighsLp *in_stack_ffffffffffff3580;
  HighsLp *lp_00;
  KktInfo *info;
  State *state_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff35b0;
  HighsLp *in_stack_ffffffffffff35b8;
  HighsLp *row_status_;
  HighsLp *in_stack_ffffffffffff35c0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff35c8;
  undefined8 in_stack_ffffffffffff35d0;
  allocator *paVar10;
  Highs *in_stack_ffffffffffff35e0;
  string *in_stack_ffffffffffff35e8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *this_02;
  undefined4 in_stack_ffffffffffff35f0;
  undefined4 in_stack_ffffffffffff35f4;
  Highs *in_stack_ffffffffffff35f8;
  vector<double,_std::allocator<double>_> *this_03;
  pointer in_stack_ffffffffffff3648;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff3650;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffff3658;
  HPresolve *in_stack_ffffffffffff3660;
  HPresolve *in_stack_ffffffffffff3668;
  HPresolve *this_04;
  undefined7 in_stack_ffffffffffff3678;
  HighsBasis *basis_00;
  Highs *this_05;
  HighsModelStatus *in_stack_ffffffffffff36d0;
  HighsBasis *in_stack_ffffffffffff36d8;
  undefined4 in_stack_ffffffffffff36e0;
  HighsOptions *options_00;
  HighsPostsolveStack *this_06;
  allocator local_c901;
  string local_c900 [8];
  HighsTimer *in_stack_ffffffffffff3708;
  HighsInt in_stack_ffffffffffff3714;
  HighsOptions *in_stack_ffffffffffff3718;
  HighsLp *in_stack_ffffffffffff3720;
  HPresolve *in_stack_ffffffffffff3728;
  HighsLp *in_stack_ffffffffffff3d38;
  Highs *in_stack_ffffffffffff3d40;
  int local_7388;
  int local_7384;
  vector<double,_std::allocator<double>_> local_7378;
  vector<double,_std::allocator<double>_> local_7360 [2];
  vector<double,_std::allocator<double>_> local_7330;
  undefined1 local_7318;
  undefined1 local_7316;
  string local_7308 [32];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_72e8;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_72d0;
  vector<int,_std::allocator<int>_> local_72b8 [9];
  HPresolve local_71d8;
  undefined1 local_6b19;
  HPresolve local_6b18;
  undefined1 local_6459;
  size_t local_6458;
  size_t local_6450;
  size_t local_6448;
  undefined1 local_6439;
  State local_6438;
  int *local_6390;
  int *local_6388;
  int *local_6380;
  byte local_6343;
  vector<double,_std::allocator<double>_> local_6340;
  undefined1 local_6328 [48];
  vector<int,_std::allocator<int>_> local_62f8;
  undefined4 local_62dc;
  vector<int,_std::allocator<int>_> local_62d8;
  undefined4 local_62bc;
  undefined1 local_62b8 [31];
  HighsBasis local_6299 [9];
  Highs local_5ee0;
  uint local_d1c;
  HighsOptions local_d18;
  HighsPostsolveStack local_660;
  undefined1 local_579;
  HighsInt local_578;
  HighsInt local_574;
  vector<double,_std::allocator<double>_> local_570;
  undefined1 local_558 [48];
  undefined1 local_528 [64];
  vector<int,_std::allocator<int>_> local_4e8 [2];
  vector<int,_std::allocator<int>_> local_4b8;
  undefined1 local_4a0 [776];
  undefined1 local_198 [56];
  undefined1 local_160 [48];
  vector<double,_std::allocator<double>_> local_130 [10];
  pointer local_40;
  
  basis_00 = (HighsBasis *)&stack0xffffffffffff3538;
  local_40 = in_RSI;
  HighsSolution::HighsSolution((HighsSolution *)in_stack_ffffffffffff3540);
  HighsBasis::HighsBasis((HighsBasis *)in_stack_ffffffffffff3560);
  HighsSolution::HighsSolution((HighsSolution *)in_stack_ffffffffffff3540);
  HighsBasis::HighsBasis((HighsBasis *)in_stack_ffffffffffff3560);
  HighsLp::HighsLp(in_stack_ffffffffffff35c0,in_stack_ffffffffffff35b8);
  local_579 = 0;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::assign
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_ffffffffffff3540,
             (size_type)in_stack_ffffffffffff3538,(value_type *)0x7143c8);
  this_06 = &local_660;
  HighsPostsolveStack::HighsPostsolveStack((HighsPostsolveStack *)in_stack_ffffffffffff3540);
  HighsPostsolveStack::initializeIndexMaps
            (in_stack_ffffffffffff3570,(HighsInt)((ulong)in_stack_ffffffffffff3568 >> 0x20),
             (HighsInt)in_stack_ffffffffffff3568);
  options_00 = &local_d18;
  HPresolve((HPresolve *)in_stack_ffffffffffff3540);
  okSetInput(in_stack_ffffffffffff3728,in_stack_ffffffffffff3720,in_stack_ffffffffffff3718,
             in_stack_ffffffffffff3714,in_stack_ffffffffffff3708);
  HVar5 = run(in_stack_ffffffffffff3668,(HighsPostsolveStack *)in_stack_ffffffffffff3660);
  if (HVar5 == kMin) {
    Highs::Highs(in_stack_ffffffffffff35e0);
    HighsLp::HighsLp(in_stack_ffffffffffff35c0,in_stack_ffffffffffff35b8);
    Highs::passModel(in_stack_ffffffffffff3d40,in_stack_ffffffffffff3d38);
    HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffff3540);
    Highs::passOptions(in_stack_ffffffffffff3548,(HighsOptions *)in_stack_ffffffffffff3540);
    in_stack_ffffffffffff36d8 = (HighsBasis *)(local_62b8 + 0x1f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_6299[0].alien,"presolve",(allocator *)in_stack_ffffffffffff36d8);
    Highs::setOptionValue
              (in_stack_ffffffffffff35f8,
               (string *)CONCAT44(in_stack_ffffffffffff35f4,in_stack_ffffffffffff35f0),
               in_stack_ffffffffffff35e8);
    std::__cxx11::string::~string((string *)&local_6299[0].alien);
    std::allocator<char>::~allocator((allocator<char> *)(local_62b8 + 0x1f));
    Highs::run(in_stack_ffffffffffff3548);
    in_stack_ffffffffffff36d0 = Highs::getModelStatus(&local_5ee0);
    HVar3 = *in_stack_ffffffffffff36d0;
    if (HVar3 == kOptimal) {
      Highs::getSolution(&local_5ee0);
      HighsSolution::operator=
                ((HighsSolution *)in_stack_ffffffffffff3540,
                 (HighsSolution *)in_stack_ffffffffffff3538);
      Highs::getBasis(&local_5ee0);
      HighsBasis::operator=
                ((HighsBasis *)in_stack_ffffffffffff3540,(HighsBasis *)in_stack_ffffffffffff3538);
    }
    local_d1c = (uint)(HVar3 != kOptimal);
    Highs::~Highs(in_stack_ffffffffffff3540);
  }
  else {
    local_d1c = 1;
  }
  ~HPresolve((HPresolve *)in_stack_ffffffffffff3540);
  if (local_d1c == 0) {
    HighsLp::operator=((HighsLp *)in_stack_ffffffffffff3540,in_stack_ffffffffffff3538);
    HighsSolution::operator=
              ((HighsSolution *)in_stack_ffffffffffff3540,(HighsSolution *)in_stack_ffffffffffff3538
              );
    HighsBasis::operator=
              ((HighsBasis *)in_stack_ffffffffffff3540,(HighsBasis *)in_stack_ffffffffffff3538);
    HighsPostsolveStack::undo
              (this_06,options_00,(HighsSolution *)CONCAT44(HVar5,in_stack_ffffffffffff36e0),
               in_stack_ffffffffffff36d8,(HighsInt)((ulong)in_stack_ffffffffffff36d0 >> 0x20));
    refineBasis(in_stack_ffffffffffff3580,in_stack_ffffffffffff3578,
                (HighsBasis *)in_stack_ffffffffffff3570);
    calculateRowValuesQuad
              ((HighsLp *)in_stack_ffffffffffff3540,(HighsSolution *)in_stack_ffffffffffff3538,0);
    local_62bc = 1;
    std::allocator<int>::allocator((allocator<int> *)0x71481b);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff3560,
               in_stack_ffffffffffff3558,(value_type_conflict2 *)in_stack_ffffffffffff3550,
               (allocator_type *)in_stack_ffffffffffff3548);
    std::allocator<int>::~allocator((allocator<int> *)0x71484f);
    local_62dc = 1;
    std::allocator<int>::allocator((allocator<int> *)0x714883);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff3560,
               in_stack_ffffffffffff3558,(value_type_conflict2 *)in_stack_ffffffffffff3550,
               (allocator_type *)in_stack_ffffffffffff3548);
    std::allocator<int>::~allocator((allocator<int> *)0x7148b7);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7148c4);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7148d1);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x7148de);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x7148eb);
    dev_kkt_check::initInfo();
    local_6388 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff3538);
    local_6380 = (int *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)in_stack_ffffffffffff3548,
                                    (difference_type)in_stack_ffffffffffff3540);
    local_6390 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff3538);
    std::vector<int,std::allocator<int>>::
    assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              (in_stack_ffffffffffff3550,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               in_stack_ffffffffffff3560,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               in_stack_ffffffffffff3558);
    highsSparseTranspose
              ((HighsInt)((ulong)in_stack_ffffffffffff35d0 >> 0x20),
               (HighsInt)in_stack_ffffffffffff35d0,in_stack_ffffffffffff35c8,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff35c0,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffff35b8,
               in_stack_ffffffffffff35b0,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff35e0,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffff35e8);
    solution = (HighsLp *)local_4a0;
    colCost_ = &local_570;
    this_00 = local_558;
    colUpper_ = (vector<double,_std::allocator<double>_> *)(local_558 + 0x18);
    this_01 = (HighsPostsolveStack *)local_528;
    solution_00 = (HighsSolution *)(local_528 + 0x18);
    info = (KktInfo *)(local_198 + 0x20);
    state_00 = (State *)local_160;
    this_05 = (Highs *)(local_4a0 + 0x2f0);
    row_status_ = (HighsLp *)local_198;
    lp_00 = (HighsLp *)local_62b8;
    ARvalue_ = &local_6340;
    this = (Highs *)local_6328;
    in_stack_ffffffffffff3540 = (Highs *)(local_6328 + 0x18);
    dev_kkt_check::State::State
              (&local_6438,local_578,local_574,local_4e8,&local_62f8,&local_4b8,
               (vector<double,_std::allocator<double>_> *)solution,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffff3540,
               (vector<int,_std::allocator<int>_> *)this,ARvalue_,
               (vector<double,_std::allocator<double>_> *)colCost_,
               (vector<double,_std::allocator<double>_> *)this_00,colUpper_,
               (vector<double,_std::allocator<double>_> *)this_01,
               (vector<double,_std::allocator<double>_> *)solution_00,
               (vector<int,_std::allocator<int>_> *)lp_00,&local_62d8,
               (vector<double,_std::allocator<double>_> *)info,
               (vector<double,_std::allocator<double>_> *)state_00,
               (vector<double,_std::allocator<double>_> *)(local_160 + 0x18),local_130,
               (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this_05,
               (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)row_status_);
    uVar4 = dev_kkt_check::checkKkt(state_00,info);
    local_6439 = uVar4;
    if (((bool)uVar4) && ((local_6343 & 1) != 0)) {
      printf("kkt check of postsolved solution and basis passed\n");
      local_d1c = 1;
    }
    else {
      local_6448 = HighsPostsolveStack::numReductions((HighsPostsolveStack *)0x714bf6);
      local_6450 = 0;
      local_6458 = local_6448 >> 1;
      do {
        HighsLp::operator=((HighsLp *)in_stack_ffffffffffff3540,solution);
        local_6459 = 0;
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::assign
                  ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_ffffffffffff3540,
                   (size_type)solution,(value_type *)0x714c76);
        this_04 = &local_6b18;
        HPresolve((HPresolve *)in_stack_ffffffffffff3540);
        okSetInput(in_stack_ffffffffffff3728,in_stack_ffffffffffff3720,in_stack_ffffffffffff3718,
                   in_stack_ffffffffffff3714,in_stack_ffffffffffff3708);
        computeIntermediateMatrix
                  (in_stack_ffffffffffff3660,in_stack_ffffffffffff3658,in_stack_ffffffffffff3650,
                   (size_t *)in_stack_ffffffffffff3648);
        ~HPresolve((HPresolve *)in_stack_ffffffffffff3540);
        HighsLp::operator=((HighsLp *)in_stack_ffffffffffff3540,solution);
        local_6b19 = 0;
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::assign
                  ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)in_stack_ffffffffffff3540,
                   (size_type)solution,(value_type *)0x714d2a);
        in_stack_ffffffffffff3660 = &local_71d8;
        HPresolve((HPresolve *)in_stack_ffffffffffff3540);
        okSetInput(in_stack_ffffffffffff3728,in_stack_ffffffffffff3720,in_stack_ffffffffffff3718,
                   in_stack_ffffffffffff3714,in_stack_ffffffffffff3708);
        in_stack_ffffffffffff3658 = local_72b8;
        HighsPostsolveStack::HighsPostsolveStack((HighsPostsolveStack *)in_stack_ffffffffffff3540);
        HighsPostsolveStack::initializeIndexMaps
                  (this_01,(HighsInt)((ulong)colUpper_ >> 0x20),(HighsInt)colUpper_);
        setReductionLimit(&local_71d8,local_6458);
        run(this_04,(HighsPostsolveStack *)in_stack_ffffffffffff3660);
        HighsSolution::operator=
                  ((HighsSolution *)in_stack_ffffffffffff3540,(HighsSolution *)solution);
        HighsBasis::operator=((HighsBasis *)in_stack_ffffffffffff3540,(HighsBasis *)solution);
        in_stack_ffffffffffff3648 = local_40;
        in_stack_ffffffffffff3650 =
             (vector<int,_std::allocator<int>_> *)
             HighsPostsolveStack::numReductions((HighsPostsolveStack *)0x714e16);
        HighsPostsolveStack::undoUntil
                  (this_06,options_00,(HighsSolution *)CONCAT44(HVar5,in_stack_ffffffffffff36e0),
                   in_stack_ffffffffffff36d8,(size_t)in_stack_ffffffffffff36d0);
        HighsBasis::HighsBasis((HighsBasis *)this_00);
        HighsSolution::HighsSolution((HighsSolution *)in_stack_ffffffffffff3540);
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this_00,colCost_);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)this_00,colCost_);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)this_00,colCost_);
        for (local_7384 = 0; local_7384 != local_578; local_7384 = local_7384 + 1) {
          HVar6 = HighsPostsolveStack::getOrigColIndex
                            ((HighsPostsolveStack *)in_stack_ffffffffffff3540,
                             (HighsInt)((ulong)solution >> 0x20));
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)local_160,(long)HVar6);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (local_7360,(long)local_7384);
          *pvVar7 = vVar1;
          HVar6 = HighsPostsolveStack::getOrigColIndex
                            ((HighsPostsolveStack *)in_stack_ffffffffffff3540,
                             (HighsInt)((ulong)solution >> 0x20));
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_198 + 0x20),
                              (long)HVar6);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_7378,(long)local_7384);
          *pvVar7 = vVar1;
          HVar6 = HighsPostsolveStack::getOrigColIndex
                            ((HighsPostsolveStack *)in_stack_ffffffffffff3540,
                             (HighsInt)((ulong)solution >> 0x20));
          pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)
                              (local_4a0 + 0x2f0),(long)HVar6);
          vVar2 = *pvVar8;
          pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (&local_72e8,(long)local_7384);
          *pvVar8 = vVar2;
        }
        std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
                  ((vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)this_00,colCost_);
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)this_00,colCost_);
        for (local_7388 = 0; local_7388 != local_574; local_7388 = local_7388 + 1) {
          this_03 = local_130;
          HVar6 = HighsPostsolveStack::getOrigRowIndex
                            ((HighsPostsolveStack *)in_stack_ffffffffffff3540,
                             (HighsInt)((ulong)solution >> 0x20));
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_03,(long)HVar6);
          in_stack_ffffffffffff35e0 = (Highs *)*pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_7330,(long)local_7388);
          *pvVar7 = (value_type)in_stack_ffffffffffff35e0;
          this_02 = (vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *)local_198;
          HVar6 = HighsPostsolveStack::getOrigRowIndex
                            ((HighsPostsolveStack *)in_stack_ffffffffffff3540,
                             (HighsInt)((ulong)solution >> 0x20));
          pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (this_02,(long)HVar6);
          vVar2 = *pvVar8;
          pvVar8 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (&local_72d0,(long)local_7388);
          *pvVar8 = vVar2;
        }
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)this_00,colCost_);
        calculateRowValuesQuad((HighsLp *)in_stack_ffffffffffff3540,(HighsSolution *)solution,0);
        local_7318 = 1;
        local_7316 = 1;
        refineBasis(lp_00,solution_00,(HighsBasis *)this_01);
        Highs::Highs(in_stack_ffffffffffff35e0);
        Highs::passOptions(this,(HighsOptions *)in_stack_ffffffffffff3540);
        HighsLp::HighsLp(in_stack_ffffffffffff35c0,row_status_);
        Highs::passModel(in_stack_ffffffffffff3d40,in_stack_ffffffffffff3d38);
        HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffff3540);
        std::__cxx11::string::operator=(local_7308,"HPresolve::debug");
        paVar10 = &local_c901;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c900,"",paVar10);
        Highs::setBasis(this_05,basis_00,(string *)CONCAT17(uVar4,in_stack_ffffffffffff3678));
        std::__cxx11::string::~string(local_c900);
        std::allocator<char>::~allocator((allocator<char> *)&local_c901);
        Highs::run(this);
        pHVar9 = Highs::getInfo((Highs *)&stack0xffffffffffff3ab8);
        printf("simplex iterations with postsolved basis: %d\n",
               (ulong)(uint)(pHVar9->super_HighsInfoStruct).simplex_iteration_count);
        in_stack_ffffffffffff35c0 = (HighsLp *)Highs::getInfo((Highs *)&stack0xffffffffffff3ab8);
        local_6439 = ((HighsInfoStruct *)&in_stack_ffffffffffff35c0->col_cost_)->
                     simplex_iteration_count == 0;
        if (local_6450 == local_6448 - 1) {
          local_d1c = 2;
        }
        else {
          if ((bool)local_6439) {
            local_6448 = local_6458;
          }
          else {
            local_6450 = local_6458;
          }
          local_6458 = local_6450 + local_6448 >> 1;
          printf("binary search ongoing: good=%zu, bad=%zu\n",local_6448,local_6450);
          local_d1c = 0;
        }
        Highs::~Highs(in_stack_ffffffffffff3540);
        HighsSolution::~HighsSolution((HighsSolution *)in_stack_ffffffffffff3540);
        HighsBasis::~HighsBasis((HighsBasis *)in_stack_ffffffffffff3540);
        HighsPostsolveStack::~HighsPostsolveStack((HighsPostsolveStack *)in_stack_ffffffffffff3540);
        ~HPresolve((HPresolve *)in_stack_ffffffffffff3540);
      } while (local_d1c == 0);
      printf("binary search finished: good=%zu, bad=%zu\n",local_6448,local_6450);
      local_d1c = 0;
    }
    dev_kkt_check::KktInfo::~KktInfo((KktInfo *)0x715565);
    std::vector<double,_std::allocator<double>_>::~vector(ARvalue_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)ARvalue_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)ARvalue_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)ARvalue_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)ARvalue_);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)ARvalue_);
  }
  HighsPostsolveStack::~HighsPostsolveStack((HighsPostsolveStack *)in_stack_ffffffffffff3540);
  HighsLp::~HighsLp((HighsLp *)in_stack_ffffffffffff3540);
  HighsBasis::~HighsBasis((HighsBasis *)in_stack_ffffffffffff3540);
  HighsSolution::~HighsSolution((HighsSolution *)in_stack_ffffffffffff3540);
  HighsBasis::~HighsBasis((HighsBasis *)in_stack_ffffffffffff3540);
  HighsSolution::~HighsSolution((HighsSolution *)in_stack_ffffffffffff3540);
  return;
}

Assistant:

void HPresolve::debug(const HighsLp& lp, const HighsOptions& options) {
  HighsSolution reducedsol;
  HighsBasis reducedbasis;

  HighsSolution sol;
  HighsBasis basis;

  HighsLp model = lp;
  model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);

  HighsPostsolveStack postsolve_stack;
  postsolve_stack.initializeIndexMaps(lp.num_row_, lp.num_col_);
  {
    HPresolve presolve;
    presolve.okSetInput(model, options, options.presolve_reduction_limit);
    // presolve.setReductionLimit(1622017);
    if (presolve.run(postsolve_stack) != HighsModelStatus::kNotset) return;
    Highs highs;
    highs.passModel(model);
    highs.passOptions(options);
    highs.setOptionValue("presolve", kHighsOffString);
    highs.run();
    if (highs.getModelStatus() != HighsModelStatus::kOptimal) return;
    reducedsol = highs.getSolution();
    reducedbasis = highs.getBasis();
  }
  model = lp;
  sol = reducedsol;
  basis = reducedbasis;
  postsolve_stack.undo(options, sol, basis);
  refineBasis(lp, sol, basis);
  calculateRowValuesQuad(model, sol);
#if 0
  Highs highs;
  highs.passModel(model);
  highs.passOptions(options);
  highs.setSolution(sol);
  basis.debug_origin_name = "HPresolve::debug";
  highs.setBasis(basis);
  highs.run();
  return;
#endif
  std::vector<HighsInt> flagCol(lp.num_col_, 1);
  std::vector<HighsInt> flagRow(lp.num_row_, 1);
  std::vector<HighsInt> Aend;
  std::vector<HighsInt> ARstart;
  std::vector<HighsInt> ARindex;
  std::vector<double> ARvalue;
  dev_kkt_check::KktInfo kktinfo = dev_kkt_check::initInfo();
  Aend.assign(model.a_matrix_.start_.begin() + 1, model.a_matrix_.start_.end());
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart,
                       ARindex, ARvalue);
  dev_kkt_check::State state(
      model.num_col_, model.num_row_, model.a_matrix_.start_, Aend,
      model.a_matrix_.index_, model.a_matrix_.value_, ARstart, ARindex, ARvalue,
      model.col_cost_, model.col_lower_, model.col_upper_, model.row_lower_,
      model.row_upper_, flagCol, flagRow, sol.col_value, sol.col_dual,
      sol.row_value, sol.row_dual, basis.col_status, basis.row_status);
  bool checkResult = dev_kkt_check::checkKkt(state, kktinfo);
  if (checkResult && kktinfo.pass_bfs) {
    printf("kkt check of postsolved solution and basis passed\n");
    return;
  }
  size_t good = postsolve_stack.numReductions();
  size_t bad = 0;
  size_t reductionLim = (good + bad) / 2;

  // good = 1734357, bad = 1734289;
  // good = 1050606, bad = 1050605;
  // good = 1811527, bad = 1811526;
  // reductionLim = bad;
  do {
    model = lp;
    model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);

    {
      HPresolve presolve;
      presolve.okSetInput(model, options, options.presolve_reduction_limit);
      presolve.computeIntermediateMatrix(flagRow, flagCol, reductionLim);
    }
#if 1
    model = lp;
    model.integrality_.assign(lp.num_col_, HighsVarType::kContinuous);
    HPresolve presolve;
    presolve.okSetInput(model, options, options.presolve_reduction_limit);
    HighsPostsolveStack tmp;
    tmp.initializeIndexMaps(model.num_row_, model.num_col_);
    presolve.setReductionLimit(reductionLim);
    presolve.run(tmp);

    sol = reducedsol;
    basis = reducedbasis;
    postsolve_stack.undoUntil(options, sol, basis, tmp.numReductions());

    HighsBasis temp_basis;
    HighsSolution temp_sol;
    temp_basis.col_status.resize(model.num_col_);
    temp_sol.col_dual.resize(model.num_col_);
    temp_sol.col_value.resize(model.num_col_);
    for (HighsInt i = 0; i != model.num_col_; ++i) {
      temp_sol.col_dual[i] = sol.col_dual[tmp.getOrigColIndex(i)];
      temp_sol.col_value[i] = sol.col_value[tmp.getOrigColIndex(i)];
      temp_basis.col_status[i] = basis.col_status[tmp.getOrigColIndex(i)];
    }

    temp_basis.row_status.resize(model.num_row_);
    temp_sol.row_dual.resize(model.num_row_);
    for (HighsInt i = 0; i != model.num_row_; ++i) {
      temp_sol.row_dual[i] = sol.row_dual[tmp.getOrigRowIndex(i)];
      temp_basis.row_status[i] = basis.row_status[tmp.getOrigRowIndex(i)];
    }
    temp_sol.row_value.resize(model.num_row_);
    calculateRowValuesQuad(model, sol);
    temp_basis.valid = true;
    temp_basis.useful = true;
    refineBasis(model, temp_sol, temp_basis);
    Highs highs;
    highs.passOptions(options);
    highs.passModel(model);
    temp_basis.debug_origin_name = "HPresolve::debug";
    highs.setBasis(temp_basis);
    // highs.writeModel("model.mps");
    // highs.writeBasis("bad.bas");
    highs.run();
    printf("simplex iterations with postsolved basis: %" HIGHSINT_FORMAT "\n",
           highs.getInfo().simplex_iteration_count);
    checkResult = highs.getInfo().simplex_iteration_count == 0;
#else

    if (reductionLim == good) break;

    Aend.assign(model.a_matrix_.start_.begin() + 1,
                model.a_matrix_.start_.end());
    highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                         model.a_matrix_.index_, model.a_matrix_.value_,
                         ARstart, ARindex, ARvalue);
    sol = reducedsol;
    basis = reducedbasis;
    postsolve_stack.undoUntil(options, sol, basis, reductionLim);

    calculateRowValuesQuad(model, sol);
    kktinfo = dev_kkt_check::initInfo();
    checkResult = dev_kkt_check::checkKkt(state, kktinfo);
    checkResult = checkResult && kktinfo.pass_bfs;
#endif
    if (bad == good - 1) break;

    if (checkResult) {
      good = reductionLim;
    } else {
      bad = reductionLim;
    }
    reductionLim = (bad + good) / 2;
    printf("binary search ongoing: good=%zu, bad=%zu\n", good, bad);
  } while (true);

  printf("binary search finished: good=%zu, bad=%zu\n", good, bad);
  assert(false);
}